

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexFilters.cpp
# Opt level: O1

void __thiscall
Ptex::v2_2::PtexPointFilterTri::eval
          (PtexPointFilterTri *this,float *result,int firstchan,int nchannels,int faceid,float u,
          float v,float param_7,float param_8,float param_9,float param_10,float param_11,
          float param_12)

{
  PtexTexture *pPVar1;
  int iVar2;
  undefined4 extraout_var;
  float fVar3;
  uint uVar4;
  int iVar8;
  undefined1 in_register_00001204 [12];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 in_register_00001244 [12];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 in_register_00001284 [12];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  float fStack_44;
  float fStack_34;
  
  auVar11._4_12_ = in_register_00001284;
  auVar11._0_4_ = param_7;
  auVar9._4_12_ = in_register_00001244;
  auVar9._0_4_ = v;
  auVar7._4_12_ = in_register_00001204;
  auVar7._0_4_ = u;
  if (((-1 < faceid) && (0 < nchannels)) && (this->_tx != (PtexTexture *)0x0)) {
    iVar2 = (*this->_tx->_vptr_PtexTexture[0xc])(auVar7._0_8_,auVar9._0_8_,auVar11._0_8_);
    if (faceid < iVar2) {
      iVar2 = (*this->_tx->_vptr_PtexTexture[0x10])(this->_tx,faceid);
      iVar2 = 1 << (*(byte *)CONCAT44(extraout_var,iVar2) & 0x1f);
      fVar3 = (float)iVar2;
      iVar2 = iVar2 + -1;
      fStack_34 = in_register_00001204._0_4_;
      fStack_44 = in_register_00001244._0_4_;
      auVar5._0_4_ = (int)(u * fVar3);
      auVar5._4_4_ = (int)(v * fVar3);
      auVar5._8_4_ = (int)(fStack_34 * fVar3);
      auVar5._12_4_ = (int)(fStack_44 * fVar3);
      auVar12._0_4_ = -(uint)(0 < auVar5._0_4_);
      auVar12._4_4_ = -(uint)(0 < auVar5._4_4_);
      auVar12._8_4_ = -(uint)(0 < auVar5._8_4_);
      auVar12._12_4_ = -(uint)(0 < auVar5._12_4_);
      auVar12 = auVar12 & auVar5;
      auVar10._4_4_ = iVar2;
      auVar10._0_4_ = iVar2;
      auVar10._8_8_ = 0;
      auVar6._0_4_ = -(uint)(auVar12._0_4_ < iVar2);
      auVar6._4_4_ = -(uint)(auVar12._4_4_ < iVar2);
      auVar6._8_4_ = -(uint)(auVar12._8_4_ < 0);
      auVar6._12_4_ = -(uint)(auVar12._12_4_ < 0);
      auVar7 = ~auVar6 & auVar10 | auVar12 & auVar6;
      uVar4 = auVar7._0_4_;
      iVar8 = auVar7._4_4_;
      pPVar1 = this->_tx;
      if ((v * fVar3 - (float)iVar8) + (u * fVar3 - (float)(int)uVar4) <= 1.0) {
        (*pPVar1->_vptr_PtexTexture[0x15])
                  (pPVar1,faceid,(ulong)uVar4,iVar8,result,(ulong)(uint)firstchan,nchannels);
      }
      else {
        (*pPVar1->_vptr_PtexTexture[0x15])
                  (pPVar1,faceid,(ulong)(uint)(iVar2 - iVar8),(ulong)(iVar2 - uVar4),result,
                   (ulong)(uint)firstchan,nchannels);
      }
    }
  }
  return;
}

Assistant:

virtual void eval(float* result, int firstchan, int nchannels,
                      int faceid, float u, float v,
                      float /*uw1*/, float /*vw1*/, float /*uw2*/, float /*vw2*/,
                      float /*width*/, float /*blur*/)
    {
        if (!_tx || nchannels <= 0) return;
        if (faceid < 0 || faceid >= _tx->numFaces()) return;
        const FaceInfo& f = _tx->getFaceInfo(faceid);
        int res = f.res.u();
        int resm1 = res - 1;
        float ut = u * (float)res, vt = v * (float)res;
        int ui = PtexUtils::clamp(int(ut), 0, resm1);
        int vi = PtexUtils::clamp(int(vt), 0, resm1);
        float uf = ut - (float)ui, vf = vt - (float)vi;

        if (uf + vf <= 1.0f) {
            // "even" triangles are stored in lower-left half-texture
            _tx->getPixel(faceid, ui, vi, result, firstchan, nchannels);
        }
        else {
            // "odd" triangles are stored in upper-right half-texture
            _tx->getPixel(faceid, resm1-vi, resm1-ui, result, firstchan, nchannels);
        }
    }